

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udpstack.cc
# Opt level: O1

void __thiscall UdpStack::UdpStack(UdpStack *this,int testmode,sockaddr_in *local)

{
  sockaddr_in *local_00;
  undefined8 uVar1;
  in_port_t iVar2;
  in_addr iVar3;
  RestrictedUdpLayer *this_00;
  
  (this->super_UdpReceiver)._vptr_UdpReceiver = (_func_int **)&PTR__UdpStack_001567e8;
  (this->super_UdpPublisher)._vptr_UdpPublisher = (_func_int **)&PTR__UdpStack_00156820;
  this->udpLayer = (UdpLayer *)0x0;
  bdMutex::bdMutex(&this->stackMtx,false);
  iVar2 = local->sin_port;
  iVar3.s_addr = (local->sin_addr).s_addr;
  uVar1 = *(undefined8 *)local->sin_zero;
  (this->laddr).sin_family = local->sin_family;
  (this->laddr).sin_port = iVar2;
  (this->laddr).sin_addr = (in_addr)iVar3.s_addr;
  *(undefined8 *)(this->laddr).sin_zero = uVar1;
  (this->mReceivers).super__List_base<UdpReceiver_*,_std::allocator<UdpReceiver_*>_>._M_impl._M_node
  .super__List_node_base._M_prev = (_List_node_base *)&this->mReceivers;
  (this->mReceivers).super__List_base<UdpReceiver_*,_std::allocator<UdpReceiver_*>_>._M_impl._M_node
  .super__List_node_base._M_next = (_List_node_base *)&this->mReceivers;
  (this->mReceivers).super__List_base<UdpReceiver_*,_std::allocator<UdpReceiver_*>_>._M_impl._M_node
  ._M_size = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"UdpStack::UdpStack() Evoked in TestMode",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  local_00 = &this->laddr;
  if (testmode == 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"UdpStack::UdpStack() Installing TimedUdpLayer",0x2d);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    this_00 = (RestrictedUdpLayer *)operator_new(0xa8);
    TimedUdpLayer::TimedUdpLayer((TimedUdpLayer *)this_00,&this->super_UdpReceiver,local_00);
  }
  else if (testmode == 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"UdpStack::UdpStack() Installing RestrictedUdpLayer",0x32);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    this_00 = (RestrictedUdpLayer *)operator_new(0xb0);
    RestrictedUdpLayer::RestrictedUdpLayer(this_00,&this->super_UdpReceiver,local_00);
  }
  else {
    if (testmode != 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"UdpStack::UdpStack() Installing Standard UdpLayer",0x31);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
      std::ostream::put('H');
      std::ostream::flush();
      openSocket(this);
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"UdpStack::UdpStack() Installing LossyUdpLayer",0x2d);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    this_00 = (RestrictedUdpLayer *)operator_new(0xa0);
    LossyUdpLayer::LossyUdpLayer((LossyUdpLayer *)this_00,&this->super_UdpReceiver,local_00,0.1);
  }
  this->udpLayer = &this_00->super_UdpLayer;
  return;
}

Assistant:

UdpStack::UdpStack(int testmode, struct sockaddr_in &local)
	:udpLayer(NULL),
	 laddr(local) {

	std::cerr << "UdpStack::UdpStack() Evoked in TestMode" << std::endl;
	if (testmode == UDP_TEST_LOSSY_LAYER) {
		std::cerr << "UdpStack::UdpStack() Installing LossyUdpLayer" << std::endl;
		udpLayer = new LossyUdpLayer(this, laddr, UDP_TEST_LOSSY_FRAC);
	} else if (testmode == UDP_TEST_RESTRICTED_LAYER) {
		std::cerr << "UdpStack::UdpStack() Installing RestrictedUdpLayer" << std::endl;
		udpLayer = new RestrictedUdpLayer(this, laddr);
	} else if (testmode == UDP_TEST_TIMED_LAYER) {
		std::cerr << "UdpStack::UdpStack() Installing TimedUdpLayer" << std::endl;
		udpLayer = new TimedUdpLayer(this, laddr);
	} else {
		std::cerr << "UdpStack::UdpStack() Installing Standard UdpLayer" << std::endl;
		// standard layer 
		openSocket();
	}
	return;
}